

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::DescriptorSet::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  deUint32 maxSets_;
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_58;
  Parameters local_40;
  Parameters *local_20;
  Parameters *params_local;
  Environment *env_local;
  Resources *this_local;
  
  maxSets_ = env->maxResourceConsumers;
  local_20 = &params->descriptorSetLayout;
  params_local = (Parameters *)env;
  env_local = (Environment *)this;
  computePoolSizes(&local_58,&params->descriptorSetLayout,maxSets_);
  DescriptorPool::Parameters::Parameters(&local_40,1,maxSets_,&local_58);
  Dependency<vkt::api::(anonymous_namespace)::DescriptorPool>::Dependency
            (&this->descriptorPool,env,&local_40);
  DescriptorPool::Parameters::~Parameters(&local_40);
  std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::~vector
            (&local_58);
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>::Dependency
            (&this->descriptorSetLayout,(Environment *)params_local,local_20);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: descriptorPool		(env, DescriptorPool::Parameters(VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, env.maxResourceConsumers, computePoolSizes(params.descriptorSetLayout, env.maxResourceConsumers)))
			, descriptorSetLayout	(env, params.descriptorSetLayout)
		{
		}